

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall QLayout::removeWidget(QLayout *this,QWidget *widget)

{
  long *plVar1;
  long lVar2;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *child;
  int i;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI == 0) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffa8);
    QMessageLogger::warning(local_28,"QLayout::removeWidget: Cannot remove a null widget.");
  }
  else {
    iVar3 = 0;
    while (plVar1 = (long *)(**(code **)(*in_RDI + 0xa8))(in_RDI,iVar3), plVar1 != (long *)0x0) {
      lVar2 = (**(code **)(*plVar1 + 0x68))();
      if (lVar2 == in_RSI) {
        plVar1 = (long *)(**(code **)(*in_RDI + 0xb0))(in_RDI,iVar3);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
        (**(code **)(*in_RDI + 0x70))();
      }
      else {
        iVar3 = iVar3 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLayout::removeWidget(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout::removeWidget: Cannot remove a null widget.");
        return;
    }

    int i = 0;
    QLayoutItem *child;
    while ((child = itemAt(i))) {
        if (child->widget() == widget) {
            delete takeAt(i);
            invalidate();
        } else {
            ++i;
        }
    }
}